

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMockReturnValueTest::teardown
          (TEST_GROUP_CppUTestGroupMockReturnValueTest *this)

{
  MockSupport *pMVar1;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_GROUP_CppUTestGroupMockReturnValueTest *local_10;
  TEST_GROUP_CppUTestGroupMockReturnValueTest *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar1 = mock(&local_20,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"");
  pMVar1 = mock(local_40,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(local_40);
  return;
}

Assistant:

void teardown() _override
  {
      mock().checkExpectations();
      mock().clear();
  }